

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O0

void m68k_op_bclr_8_r_aw(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint mask;
  uint src;
  uint ea;
  
  uVar1 = m68ki_read_imm_16();
  uVar2 = m68ki_read_8_fc((int)(short)uVar1,m68ki_cpu.s_flag | m68ki_address_space);
  uVar3 = 1 << ((byte)m68ki_cpu.dar[m68ki_cpu.ir >> 9 & 7] & 7);
  m68ki_cpu.not_z_flag = uVar2 & uVar3;
  m68ki_write_8_fc((int)(short)uVar1,m68ki_cpu.s_flag | 1,uVar2 & (uVar3 ^ 0xffffffff));
  return;
}

Assistant:

static void m68k_op_bclr_8_r_aw(void)
{
	uint ea = EA_AW_8();
	uint src = m68ki_read_8(ea);
	uint mask = 1 << (DX & 7);

	FLAG_Z = src & mask;
	m68ki_write_8(ea, src & ~mask);
}